

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O2

void concept_const_suite::forward_iterator_multipass(void)

{
  int iVar1;
  bool bVar2;
  reference piVar3;
  initializer_list<int> __l;
  const_iterator a;
  const_iterator b;
  vector<int,_std::allocator<int>_> data;
  circular_view<int,_18446744073709551615UL> span;
  
  span.member.data = (pointer)0x160000000b;
  span.member.cap = 0x2c00000021;
  __l._M_len = 4;
  __l._M_array = (iterator)&span;
  std::vector<int,_std::allocator<int>_>::vector(&data,__l,(allocator_type *)&a);
  span.member.data = (pointer)0x0;
  if ((long)data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 0) {
    span.member.data =
         data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ;
  }
  span.member.cap =
       (long)data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start >> 2;
  span.member.size = span.member.cap;
  span.member.next = span.member.cap;
  a = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  b.parent = a.parent;
  b.current = a.current;
  bVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator==
                    (&a,&b);
  boost::detail::test_impl
            ("a == b",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x1b5,"void concept_const_suite::forward_iterator_multipass()",bVar2);
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator++(&a);
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator++(&b);
  bVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator==
                    (&a,&b);
  boost::detail::test_impl
            ("a == b",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x1b8,"void concept_const_suite::forward_iterator_multipass()",bVar2);
  piVar3 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator*
                     (&a);
  iVar1 = *piVar3;
  piVar3 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator*
                     (&b);
  boost::detail::test_impl
            ("*a == *b",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x1b9,"void concept_const_suite::forward_iterator_multipass()",iVar1 == *piVar3);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&data.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void forward_iterator_multipass()
{
    std::vector<int> data = { 11, 22, 33, 44 };
    const circular_view<int> span(data.begin(), data.end(), data.begin(), data.size());
    circular_view<int>::const_iterator a = span.begin();
    circular_view<int>::const_iterator b = a;
    BOOST_TEST(a == b);
    ++a;
    ++b;
    BOOST_TEST(a == b);
    BOOST_TEST(*a == *b);
}